

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_argsof.cpp
# Opt level: O1

void __thiscall tst_internals_argsof::lambda(tst_internals_argsof *this)

{
  return;
}

Assistant:

void tst_internals_argsof::lambda()
{
    auto lNoArg = []() {};
    auto lOneArg = [](float) {};
    auto lManyArgs = [](const float&, int, char**) {};
    auto lMutable = [](const float&, int, char**) mutable {};

    TEST_ARGS_FOR_TYPE(decltype(lNoArg), void);
    TEST_ARGS_FOR_TYPE(decltype(lOneArg), float);
    TEST_ARGS_FOR_TYPE(decltype(lManyArgs), const float&);
    TEST_ARGS_FOR_TYPE(decltype(lMutable), const float&);
}